

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

LogMessage * pfederc::logLexerError(LogMessage *__return_storage_ptr__,Lexer *lexer,LexerError *err)

{
  Position *pos;
  Level logLevel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  initializer_list<pfederc::LogMessage> __l;
  initializer_list<pfederc::LogMessage> __l_00;
  initializer_list<pfederc::LogMessage> __l_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  undefined1 local_d0 [72];
  string local_88;
  string local_68;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_48;
  
  pos = &err->pos;
  logLevel = err->logLevel;
  switch(err->err) {
  case LEX_ERR_GENERAL_INVALID_CHARACTER:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Invalid character","");
    break;
  case LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Leading _ must not be followed by digit","");
    break;
  case LEX_ERR_ID_NOT_JUST_ANYS:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Identifier must not consist of just _","");
    break;
  case LEX_ERR_STR_INVALID_ESCAPE_CODE:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Invalid escape sequence","");
    break;
  case LEX_ERR_CHAR_INVALID_END:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Expected \'","");
    logCreateErrorMessage(&local_68,lexer,pos,&local_88);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_f8,
                        (err->pos).startIndex -
                        (lexer->lineIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[(err->pos).line],(char *)0x0,0x10b160);
    std::operator+(&local_118,"Fix: Insert \'\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage((LogMessage *)local_d0,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    __l._M_len = 1;
    __l._M_array = (iterator)local_d0;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,__l,
               (allocator_type *)&local_f8);
    goto LAB_001067c4;
  case LEX_ERR_STR_INVALID_END:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Expected \"","");
    logCreateErrorMessage(&local_68,lexer,pos,&local_88);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_f8,
                        (err->pos).startIndex -
                        (lexer->lineIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[(err->pos).line],(char *)0x0,0x10b16b);
    std::operator+(&local_118,"Fix: Insert \"\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage((LogMessage *)local_d0,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)local_d0;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,
               __l_01,(allocator_type *)&local_f8);
    goto LAB_001067c4;
  case LEX_ERR_STR_HEXADECIMAL_CHAR:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Expected hexadecimal character","");
    break;
  case LEX_ERR_NUM_LEADING_ZERO:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Zero must not be the first character of decimal number","");
    logCreateErrorMessage(&local_68,lexer,pos,&local_88);
    Lexer::getLineFromIndex_abi_cxx11_(&local_f8,lexer,(err->pos).startIndex);
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::erase
                       ((ulong)&local_f8,
                        (err->pos).startIndex -
                        (lexer->lineIndices).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[(err->pos).line]);
    std::operator+(&local_118,"Fix: Remove zero\n",pbVar1);
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage((LogMessage *)local_d0,LVL_NOTE,&local_118,&local_48);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_d0;
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118,
               __l_00,(allocator_type *)&local_f8);
LAB_001067c4:
    LogMessage::LogMessage
              (__return_storage_ptr__,logLevel,&local_68,
               (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
              ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_118);
    LogMessage::~LogMessage((LogMessage *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0010691e;
  case LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Unexpected digit","");
    break;
  case LEX_ERR_NUM_UNEXPECTED_CHAR:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Unexpected character","");
    break;
  case LEX_ERR_REGION_COMMENT_END:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Expected \'*/\'","");
    break;
  default:
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Unknown error","");
  }
  logCreateErrorMessage((string *)local_d0,lexer,pos,&local_118);
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  LogMessage::LogMessage
            (__return_storage_ptr__,logLevel,(string *)local_d0,
             (vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_f8);
  std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector
            ((vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *)&local_f8);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
  }
  local_88.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  _Var2._M_p = local_118._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_0010691e:
    operator_delete(_Var2._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

LogMessage pfederc::logLexerError(const Lexer &lexer, const LexerError &err) noexcept {
  const Position &pos = err.getPosition();
  switch (err.getErrorCode()) {
  case LexerErrorCode::LEX_ERR_GENERAL_INVALID_CHARACTER:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid character"));  
  case LexerErrorCode::LEX_ERR_ID_NO_DIGIT_AFTER_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Leading _ must not be followed by digit"));  
  case LexerErrorCode::LEX_ERR_ID_NOT_JUST_ANYS:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Identifier must not consist of just _"));  
  case LexerErrorCode::LEX_ERR_STR_INVALID_ESCAPE_CODE:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Invalid escape sequence"));  
  case LexerErrorCode::LEX_ERR_CHAR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected '"),
      { _logLexerErrorCharInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_INVALID_END:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected \""),
      { _logLexerErrorStrInvalidEnd(lexer, err) });  
  case LexerErrorCode::LEX_ERR_STR_HEXADECIMAL_CHAR:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Expected hexadecimal character"));
  case LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Zero must not be the first character of decimal number"),
      { _logLexerErrorLeadingZero(lexer, err) });  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT:
    return LogMessage(err.getLogLevel(),
      logCreateErrorMessage(lexer, pos, "Unexpected digit"));  
  case LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unexpected character"));  
  case LexerErrorCode::LEX_ERR_REGION_COMMENT_END:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Expected '*/'"));
  default:
    return LogMessage(err.getLogLevel(), logCreateErrorMessage(lexer, pos, "Unknown error"));
  }
}